

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

string * chapter2::max(string *__return_storage_ptr__,string *parray,int size)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pbVar2 = std::__max_element<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_less_iter>
                     (parray,parray + size);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string max(const string *parray, int size) {
        return *max_element(parray, parray + size);
    }